

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  ulong uVar1;
  undefined8 extraout_RDX;
  size_t sVar2;
  SquareMatrix<std::complex<double>_> *this;
  complex<double> val;
  ulong local_20;
  size_t c;
  size_t r;
  SquareMatrix<std::complex<double>_> *mat_local;
  
  c = 0;
  while( true ) {
    uVar1 = dense::SquareMatrix<std::complex<double>_>::rows(mat);
    if (uVar1 <= c) break;
    local_20 = 0;
    while( true ) {
      uVar1 = dense::SquareMatrix<std::complex<double>_>::cols(mat);
      if (uVar1 <= local_20) break;
      sVar2 = c;
      this = mat;
      dense::SquareMatrix<std::complex<double>_>::operator()(mat,c,local_20);
      val._M_value._8_8_ = extraout_RDX;
      val._M_value._0_8_ = sVar2;
      print<double>((qclab *)this,val);
      local_20 = local_20 + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    c = c + 1;
  }
  return;
}

Assistant:

void printMatrix( const T& mat ) {
   for ( size_t r = 0; r < mat.rows(); ++r ) {
     for ( size_t c = 0; c < mat.cols(); ++c ) {
       print( mat(r,c) ) ;
     }
     std::cout << std::endl ;
   }
 }